

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cf-socket.c
# Opt level: O3

CURLcode socket_connect_result(Curl_easy *data,char *ipaddress,int error)

{
  CURLcode CVar1;
  char *pcVar2;
  char buffer [256];
  char acStack_118 [256];
  
  CVar1 = CURLE_OK;
  if ((error != 0xb) && (CVar1 = CURLE_OK, error != 0x73)) {
    if ((data != (Curl_easy *)0x0) && (((data->set).field_0x8bd & 0x10) != 0)) {
      pcVar2 = Curl_strerror(error,acStack_118,0x100);
      Curl_infof(data,"Immediate connect fail for %s: %s",ipaddress,pcVar2);
    }
    (data->state).os_errno = error;
    CVar1 = CURLE_COULDNT_CONNECT;
  }
  return CVar1;
}

Assistant:

static CURLcode socket_connect_result(struct Curl_easy *data,
                                      const char *ipaddress, int error)
{
  switch(error) {
  case EINPROGRESS:
  case EWOULDBLOCK:
#if defined(EAGAIN)
#if (EAGAIN) != (EWOULDBLOCK)
    /* On some platforms EAGAIN and EWOULDBLOCK are the
     * same value, and on others they are different, hence
     * the odd #if
     */
  case EAGAIN:
#endif
#endif
    return CURLE_OK;

  default:
    /* unknown error, fallthrough and try another address! */
#ifdef CURL_DISABLE_VERBOSE_STRINGS
    (void)ipaddress;
#else
    {
      char buffer[STRERROR_LEN];
      infof(data, "Immediate connect fail for %s: %s",
            ipaddress, Curl_strerror(error, buffer, sizeof(buffer)));
    }
#endif
    data->state.os_errno = error;
    /* connect failed */
    return CURLE_COULDNT_CONNECT;
  }
}